

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueueControl_Locks::test_method(test_CheckQueueControl_Locks *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  thread *thread_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range2_1;
  int x;
  bool fails_1;
  thread *thread;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  size_t i;
  iterator __end2_1;
  iterator __begin2_1;
  bool done_ack;
  bool done;
  bool has_tried;
  bool has_lock;
  mutex m;
  vector<std::thread,_std::allocator<std::thread>_> tg_1;
  iterator __end2;
  iterator __begin2;
  atomic<int> fails;
  atomic<int> nThreads;
  vector<std::thread,_std::allocator<std::thread>_> tg;
  __single_object queue;
  unique_lock<std::mutex> l;
  condition_variable cv;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd38;
  lazy_ostream *in_stack_fffffffffffffd40;
  anon_class_8_1_898ad080 in_stack_fffffffffffffd48;
  type *in_stack_fffffffffffffd50;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  lazy_ostream *in_stack_fffffffffffffd68;
  const_string *in_stack_fffffffffffffd70;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffd78;
  unit_test_log_t *this_00;
  byte local_279;
  int local_240;
  bool local_239;
  ulong local_208;
  const_string local_1e8 [2];
  lazy_ostream local_1c8;
  lazy_ostream local_ec;
  undefined1 local_d8 [64];
  thread *local_98;
  thread *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 local_70 [4];
  undefined1 local_6c [28];
  undefined1 local_50 [24];
  unit_test_log_t local_38 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FakeCheck>,unsigned_int_const&,int_const&>
            ((uint *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd38);
  std::atomic<int>::atomic((atomic<int> *)in_stack_fffffffffffffd38,0);
  std::atomic<int>::atomic((atomic<int> *)in_stack_fffffffffffffd38,0);
  for (local_208 = 0; local_208 < 3; local_208 = local_208 + 1) {
    local_88 = local_50;
    local_80 = local_6c;
    local_78 = local_70;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
              (in_stack_fffffffffffffd58,(type *)in_stack_fffffffffffffd50);
  }
  local_90 = (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)
                        in_stack_fffffffffffffd40);
  local_98 = (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::end
                       ((vector<std::thread,_std::allocator<std::thread>_> *)
                        in_stack_fffffffffffffd40);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffffd48.done,
                            (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffffd40), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
               *)in_stack_fffffffffffffd38);
    bVar1 = std::thread::joinable((thread *)in_stack_fffffffffffffd38);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)in_stack_fffffffffffffd38);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48.done,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68
               ,(const_string *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffd40,(char (*) [1])in_stack_fffffffffffffd38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48.done,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    local_ec._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffd48.done = (bool *)0x1d1f9c0;
    in_stack_fffffffffffffd40 = &local_ec;
    in_stack_fffffffffffffd38 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1bc94e6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::atomic<int>,int>
              (local_d8,(undefined1 *)((long)&local_ec._vptr_lazy_ostream + 4),0x17a,2,2,local_70);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd48.done);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd38);
  std::mutex::mutex((mutex *)in_stack_fffffffffffffd38);
  std::condition_variable::condition_variable((condition_variable *)local_38);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffd48.done,
             (mutex_type *)in_stack_fffffffffffffd40);
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__1>
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::condition_variable::wait<checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__2>
            ((condition_variable *)in_stack_fffffffffffffd40,
             (unique_lock<std::mutex> *)in_stack_fffffffffffffd38,
             (anon_class_8_1_f04da12e)in_stack_fffffffffffffd48.done);
  local_239 = false;
  local_240 = 0;
  while( true ) {
    local_279 = 0;
    if (local_240 < 100) {
      local_279 = local_239 ^ 0xff;
    }
    if ((local_279 & 1) == 0) break;
    std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
    operator->((unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_> *)
               in_stack_fffffffffffffd38);
    local_239 = AnnotatedMixin<std::mutex>::try_lock
                          ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd38);
    local_240 = local_240 + 1;
  }
  this_00 = local_38;
  std::condition_variable::notify_one();
  std::condition_variable::wait<checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__3>
            ((condition_variable *)in_stack_fffffffffffffd40,
             (unique_lock<std::mutex> *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd48);
  std::condition_variable::notify_one();
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48.done,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffd68,
               (const_string *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd48.done,
               SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0));
    in_stack_fffffffffffffd68 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48.done,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffd40,(basic_cstring<const_char> *)in_stack_fffffffffffffd38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48.done,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd38 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe58,&local_1c8,local_1e8,0x19e,REQUIRE,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd67 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd67);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffd38);
  std::vector<std::thread,_std::allocator<std::thread>_>::begin
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd40);
  std::vector<std::thread,_std::allocator<std::thread>_>::end
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd40);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffffd48.done,
                            (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffffd40), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
               *)in_stack_fffffffffffffd38);
    bVar1 = std::thread::joinable((thread *)in_stack_fffffffffffffd38);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)in_stack_fffffffffffffd38);
  }
  std::condition_variable::~condition_variable((condition_variable *)local_38);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd48.done);
  std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_> *)
              in_stack_fffffffffffffd48.done);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueueControl_Locks)
{
    auto queue = std::make_unique<Standard_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    {
        std::vector<std::thread> tg;
        std::atomic<int> nThreads {0};
        std::atomic<int> fails {0};
        for (size_t i = 0; i < 3; ++i) {
            tg.emplace_back(
                    [&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    // While sleeping, no other thread should execute to this point
                    auto observed = ++nThreads;
                    UninterruptibleSleep(std::chrono::milliseconds{10});
                    fails += observed  != nThreads;
                    });
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
        BOOST_REQUIRE_EQUAL(fails, 0);
    }
    {
        std::vector<std::thread> tg;
        std::mutex m;
        std::condition_variable cv;
        bool has_lock{false};
        bool has_tried{false};
        bool done{false};
        bool done_ack{false};
        {
            std::unique_lock<std::mutex> l(m);
            tg.emplace_back([&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    std::unique_lock<std::mutex> ll(m);
                    has_lock = true;
                    cv.notify_one();
                    cv.wait(ll, [&]{return has_tried;});
                    done = true;
                    cv.notify_one();
                    // Wait until the done is acknowledged
                    //
                    cv.wait(ll, [&]{return done_ack;});
                    });
            // Wait for thread to get the lock
            cv.wait(l, [&](){return has_lock;});
            bool fails = false;
            for (auto x = 0; x < 100 && !fails; ++x) {
                fails = queue->m_control_mutex.try_lock();
            }
            has_tried = true;
            cv.notify_one();
            cv.wait(l, [&](){return done;});
            // Acknowledge the done
            done_ack = true;
            cv.notify_one();
            BOOST_REQUIRE(!fails);
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
    }
}